

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

int imagetotga(opj_image_t *image,char *outfile)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  uint local_8c;
  int local_88;
  int local_84;
  bool local_7d;
  uint local_7c;
  uint index;
  size_t res;
  FILE *fdest;
  float scale;
  float fStack_5c;
  uchar value;
  float a;
  float b;
  float g;
  float r;
  uint alpha_channel;
  int fails;
  int adjustB;
  int adjustG;
  int adjustR;
  uint i;
  OPJ_BOOL write_alpha;
  int y;
  int x;
  int bpp;
  int height;
  int width;
  char *outfile_local;
  opj_image_t *image_local;
  
  fails = 0;
  alpha_channel = 0;
  r = 1.4013e-45;
  _height = outfile;
  outfile_local = (char *)image;
  __s = fopen(outfile,"wb");
  if (__s == (FILE *)0x0) {
    fprintf(_stderr,"ERROR -> failed to open %s for writing\n",_height);
    image_local._4_4_ = 1.4013e-45;
  }
  else {
    for (adjustG = 0; (uint)adjustG < *(int *)(outfile_local + 0x10) - 1U; adjustG = adjustG + 1) {
      if ((((**(int **)(outfile_local + 0x18) !=
             *(int *)(*(long *)(outfile_local + 0x18) + (ulong)(adjustG + 1) * 0x40)) ||
           (*(int *)(*(long *)(outfile_local + 0x18) + 4) !=
            *(int *)(*(long *)(outfile_local + 0x18) + (ulong)(adjustG + 1) * 0x40 + 4))) ||
          (*(int *)(*(long *)(outfile_local + 0x18) + 0x18) !=
           *(int *)(*(long *)(outfile_local + 0x18) + (ulong)(adjustG + 1) * 0x40 + 0x18))) ||
         (*(int *)(*(long *)(outfile_local + 0x18) + 0x20) !=
          *(int *)(*(long *)(outfile_local + 0x18) + (ulong)(adjustG + 1) * 0x40 + 0x20))) {
        fclose(__s);
        fprintf(_stderr,"Unable to create a tga file with such J2K image charateristics.\n");
        return 1;
      }
    }
    bpp = *(int *)(*(long *)(outfile_local + 0x18) + 8);
    x = *(int *)(*(long *)(outfile_local + 0x18) + 0xc);
    local_7d = true;
    if (*(int *)(outfile_local + 0x10) != 2) {
      local_7d = *(int *)(outfile_local + 0x10) == 4;
    }
    adjustR = (int)local_7d;
    y = 0x18;
    if (adjustR != 0) {
      y = 0x20;
    }
    iVar1 = tga_writeheader((FILE *)__s,y,bpp,x,1);
    if (iVar1 != 0) {
      g = (float)(*(int *)(outfile_local + 0x10) + -1);
      fdest._0_4_ = 255.0 / (float)((1 << ((byte)*(undefined4 *)
                                                  (*(long *)(outfile_local + 0x18) + 0x18) & 0x1f))
                                   + -1);
      if (*(int *)(*(long *)(outfile_local + 0x18) + 0x20) == 0) {
        local_84 = 0;
      }
      else {
        local_84 = 1 << ((char)*(undefined4 *)(*(long *)(outfile_local + 0x18) + 0x18) - 1U & 0x1f);
      }
      adjustB = local_84;
      if (2 < *(uint *)(outfile_local + 0x10)) {
        if (*(int *)(*(long *)(outfile_local + 0x18) + 0x60) == 0) {
          local_88 = 0;
        }
        else {
          local_88 = 1 << ((char)*(undefined4 *)(*(long *)(outfile_local + 0x18) + 0x58) - 1U & 0x1f
                          );
        }
        fails = local_88;
        if (*(int *)(*(long *)(outfile_local + 0x18) + 0xa0) == 0) {
          local_8c = 0;
        }
        else {
          local_8c = 1 << ((char)*(undefined4 *)(*(long *)(outfile_local + 0x18) + 0x98) - 1U & 0x1f
                          );
        }
        alpha_channel = local_8c;
      }
      for (i = 0; (int)i < x; i = i + 1) {
        local_7c = i * bpp;
        for (write_alpha = 0; write_alpha < bpp; write_alpha = write_alpha + 1) {
          b = (float)(*(int *)(*(long *)(*(long *)(outfile_local + 0x18) + 0x30) +
                              (ulong)local_7c * 4) + adjustB);
          fStack_5c = b;
          a = b;
          if (2 < *(uint *)(outfile_local + 0x10)) {
            fStack_5c = (float)(int)(*(int *)(*(long *)(*(long *)(outfile_local + 0x18) + 0xb0) +
                                             (ulong)local_7c * 4) + alpha_channel);
            a = (float)(*(int *)(*(long *)(*(long *)(outfile_local + 0x18) + 0x70) +
                                (ulong)local_7c * 4) + fails);
          }
          if (fStack_5c <= 255.0) {
            if (fStack_5c < 0.0) {
              fStack_5c = 0.0;
            }
          }
          else {
            fStack_5c = 255.0;
          }
          fdest._7_1_ = (undefined1)(int)(fStack_5c * fdest._0_4_);
          sVar2 = fwrite((void *)((long)&fdest + 7),1,1,__s);
          if (sVar2 == 0) {
            fprintf(_stderr,"failed to write 1 byte for %s\n",_height);
            goto LAB_00109c92;
          }
          if (a <= 255.0) {
            if (a < 0.0) {
              a = 0.0;
            }
          }
          else {
            a = 255.0;
          }
          fdest._7_1_ = (undefined1)(int)(a * fdest._0_4_);
          sVar2 = fwrite((void *)((long)&fdest + 7),1,1,__s);
          if (sVar2 == 0) {
            fprintf(_stderr,"failed to write 1 byte for %s\n",_height);
            goto LAB_00109c92;
          }
          if (b <= 255.0) {
            if (b < 0.0) {
              b = 0.0;
            }
          }
          else {
            b = 255.0;
          }
          fdest._7_1_ = (undefined1)(int)(b * fdest._0_4_);
          sVar2 = fwrite((void *)((long)&fdest + 7),1,1,__s);
          if (sVar2 == 0) {
            fprintf(_stderr,"failed to write 1 byte for %s\n",_height);
            goto LAB_00109c92;
          }
          if (adjustR != 0) {
            scale = (float)*(int *)(*(long *)(*(long *)(outfile_local + 0x18) +
                                              (ulong)(uint)g * 0x40 + 0x30) + (ulong)local_7c * 4);
            if (scale <= 255.0) {
              if (scale < 0.0) {
                scale = 0.0;
              }
            }
            else {
              scale = 255.0;
            }
            fdest._7_1_ = (undefined1)(int)(scale * fdest._0_4_);
            sVar2 = fwrite((void *)((long)&fdest + 7),1,1,__s);
            if (sVar2 == 0) {
              fprintf(_stderr,"failed to write 1 byte for %s\n",_height);
              goto LAB_00109c92;
            }
          }
          local_7c = local_7c + 1;
        }
      }
      r = 0.0;
    }
LAB_00109c92:
    fclose(__s);
    image_local._4_4_ = r;
  }
  return (int)image_local._4_4_;
}

Assistant:

int imagetotga(opj_image_t * image, const char *outfile)
{
    int width, height, bpp, x, y;
    OPJ_BOOL write_alpha;
    unsigned int i;
    int adjustR, adjustG = 0, adjustB = 0, fails;
    unsigned int alpha_channel;
    float r, g, b, a;
    unsigned char value;
    float scale;
    FILE *fdest;
    size_t res;
    fails = 1;

    fdest = fopen(outfile, "wb");
    if (!fdest) {
        fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
        return 1;
    }

    for (i = 0; i < image->numcomps - 1; i++) {
        if ((image->comps[0].dx != image->comps[i + 1].dx)
                || (image->comps[0].dy != image->comps[i + 1].dy)
                || (image->comps[0].prec != image->comps[i + 1].prec)
                || (image->comps[0].sgnd != image->comps[i + 1].sgnd)) {
            fclose(fdest);
            fprintf(stderr,
                    "Unable to create a tga file with such J2K image charateristics.\n");
            return 1;
        }
    }

    width  = (int)image->comps[0].w;
    height = (int)image->comps[0].h;

    /* Mono with alpha, or RGB with alpha. */
    write_alpha = (image->numcomps == 2) || (image->numcomps == 4);

    /* Write TGA header  */
    bpp = write_alpha ? 32 : 24;

    if (!tga_writeheader(fdest, bpp, width, height, OPJ_TRUE)) {
        goto fin;
    }

    alpha_channel = image->numcomps - 1;

    scale = 255.0f / (float)((1 << image->comps[0].prec) - 1);

    adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);
    if (image->numcomps >= 3) {
        adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
        adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
    }

    for (y = 0; y < height; y++) {
        unsigned int index = (unsigned int)(y * width);

        for (x = 0; x < width; x++, index++) {
            r = (float)(image->comps[0].data[index] + adjustR);

            if (image->numcomps > 2) {
                g = (float)(image->comps[1].data[index] + adjustG);
                b = (float)(image->comps[2].data[index] + adjustB);
            } else {
                /* Greyscale ... */
                g = r;
                b = r;
            }

            /* TGA format writes BGR ... */
            if (b > 255.) {
                b = 255.;
            } else if (b < 0.) {
                b = 0.;
            }
            value = (unsigned char)(b * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }
            if (g > 255.) {
                g = 255.;
            } else if (g < 0.) {
                g = 0.;
            }
            value = (unsigned char)(g * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }
            if (r > 255.) {
                r = 255.;
            } else if (r < 0.) {
                r = 0.;
            }
            value = (unsigned char)(r * scale);
            res = fwrite(&value, 1, 1, fdest);

            if (res < 1) {
                fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                goto fin;
            }

            if (write_alpha) {
                a = (float)(image->comps[alpha_channel].data[index]);
                if (a > 255.) {
                    a = 255.;
                } else if (a < 0.) {
                    a = 0.;
                }
                value = (unsigned char)(a * scale);
                res = fwrite(&value, 1, 1, fdest);

                if (res < 1) {
                    fprintf(stderr, "failed to write 1 byte for %s\n", outfile);
                    goto fin;
                }
            }
        }
    }
    fails = 0;
fin:
    fclose(fdest);

    return fails;
}